

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

int Wlc_PrsWriteErrorMessage(Wlc_Prs_t *p,char *pCur,char *format,...)

{
  char in_AL;
  char *__s;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [24];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  uint local_4c;
  undefined1 local_48 [4];
  int iLine;
  va_list args;
  char *pMessage;
  char *format_local;
  char *pCur_local;
  Wlc_Prs_t *p_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_108;
  args[0]._0_8_ = &stack0x00000008;
  iLine = 0x30;
  local_48 = (undefined1  [4])0x18;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  __s = vnsprintf(format,(__va_list_tag *)local_48);
  sVar1 = strlen(__s);
  if (899 < sVar1) {
    __assert_fail("strlen(pMessage) < WLV_PRS_MAX_LINE - 100",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadVer.c"
                  ,0x89,"int Wlc_PrsWriteErrorMessage(Wlc_Prs_t *, char *, const char *, ...)");
  }
  if (p->sError[0] != '\0') {
    __assert_fail("p->sError[0] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadVer.c"
                  ,0x8a,"int Wlc_PrsWriteErrorMessage(Wlc_Prs_t *, char *, const char *, ...)");
  }
  if (pCur == (char *)0x0) {
    sprintf(p->sError,"%s: %s\n",p->pFileName,__s);
  }
  else {
    local_4c = Wlc_PrsFindLine(p,pCur);
    sprintf(p->sError,"%s (line %d): %s\n",p->pFileName,(ulong)local_4c,__s);
  }
  if (__s != (char *)0x0) {
    free(__s);
  }
  return 0;
}

Assistant:

int Wlc_PrsWriteErrorMessage( Wlc_Prs_t * p, char * pCur, const char * format, ... )
{
    char * pMessage;
    // derive message
    va_list args;
    va_start( args, format );
    pMessage = vnsprintf( format, args );
    va_end( args );
    // print messsage
    assert( strlen(pMessage) < WLV_PRS_MAX_LINE - 100 );
    assert( p->sError[0] == 0 );
    if ( pCur == NULL ) // the line number is not given
        sprintf( p->sError, "%s: %s\n", p->pFileName, pMessage );
    else                // print the error message with the line number
    {
        int iLine = Wlc_PrsFindLine( p, pCur );
        sprintf( p->sError, "%s (line %d): %s\n", p->pFileName, iLine, pMessage );
    }
    ABC_FREE( pMessage );
    return 0;
}